

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,Privkey *parent_key,Privkey *privkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *this_00;
  allocator local_c9;
  string local_c8;
  CfdSourceLocation local_a8;
  Pubkey local_80;
  ByteData160 local_68;
  ByteData local_50;
  uint8_t local_31;
  ByteData256 *pBStack_30;
  uint8_t depth_local;
  ByteData256 *chain_code_local;
  Privkey *privkey_local;
  Privkey *parent_key_local;
  ExtPrivkey *pEStack_10;
  NetType network_type_local;
  ExtPrivkey *this_local;
  
  local_31 = depth;
  pBStack_30 = chain_code;
  chain_code_local = (ByteData256 *)privkey;
  privkey_local = parent_key;
  parent_key_local._4_4_ = network_type;
  pEStack_10 = this;
  Privkey::GeneratePubkey(&local_80,parent_key,true);
  HashUtil::Hash160(&local_68,&local_80);
  ByteData160::GetData(&local_50,&local_68);
  ExtPrivkey(this,network_type,&local_50,(Privkey *)chain_code_local,pBStack_30,local_31,child_num);
  ByteData::~ByteData(&local_50);
  ByteData160::~ByteData160(&local_68);
  Pubkey::~Pubkey(&local_80);
  bVar1 = Privkey::IsValid(privkey_local);
  if (!bVar1) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x224;
    local_a8.funcname = "ExtPrivkey";
    logger::warn<>(&local_a8,"invalid privkey.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_c8,"Failed to privkey. ExtPrivkey invalid privkey.",&local_c9);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_c8);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const Privkey& parent_key, const Privkey& privkey,
    const ByteData256& chain_code, uint8_t depth, uint32_t child_num)
    : ExtPrivkey(
          network_type,
          HashUtil::Hash160(parent_key.GeneratePubkey()).GetData(), privkey,
          chain_code, depth, child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }
}